

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O3

civil_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneLibC *this,civil_second *cs)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar11;
  diff_t dVar12;
  tm *ptVar13;
  tm *ptVar14;
  duration dVar15;
  rep rVar16;
  long lVar17;
  long lVar18;
  time_t t1;
  time_t t0;
  tm tm1;
  tm tm0;
  tm tm;
  long local_108;
  rep local_100;
  duration local_f8;
  duration local_f0;
  int local_e4;
  long local_e0;
  tm local_d8;
  tm local_a0;
  tm local_68;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined6 uVar5;
  undefined1 uVar6;
  undefined5 uVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  undefined3 uVar10;
  
  if (this->local_ == false) {
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::min_tp_cs == '\0') {
      MakeTime();
    }
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::max_tp_cs == '\0') {
      MakeTime();
    }
    rVar16 = 0x7fffffffffffffff;
    bVar11 = detail::operator<(cs,&MakeTime::min_tp_cs);
    if (bVar11) {
      rVar16 = -0x8000000000000000;
    }
    else {
      bVar11 = detail::operator<(&MakeTime::max_tp_cs,cs);
      if (!bVar11) {
        uVar2._0_1_ = (cs->f_).m;
        uVar3 = (cs->f_).d;
        uVar4 = (cs->f_).hh;
        uVar6 = (cs->f_).mm;
        uVar8 = (cs->f_).ss;
        uVar10 = *(undefined3 *)&(cs->f_).field_0xd;
        uVar9 = CONCAT31(uVar10,uVar8);
        uVar7 = CONCAT41(uVar9,uVar6);
        uVar5 = CONCAT51(uVar7,uVar4);
        uVar2._1_7_ = CONCAT61(uVar5,uVar3);
        dVar12 = detail::difference((detail *)(cs->f_).y,uVar2,0x7b2,0x101);
        rVar16 = dVar12 * 0x3c + (long)((int)uVar2._1_7_ >> 0x18);
      }
    }
    __return_storage_ptr__->kind = UNIQUE;
    (__return_storage_ptr__->pre).__d.__r = rVar16;
    (__return_storage_ptr__->trans).__d.__r = rVar16;
    (__return_storage_ptr__->post).__d.__r = rVar16;
    return __return_storage_ptr__;
  }
  uVar1 = (cs->f_).y;
  if ((long)uVar1 < 0) {
    if (uVar1 < 0xffffffff8000076c) {
      __return_storage_ptr__->kind = UNIQUE;
      local_f0.__r = -0x8000000000000000;
      goto LAB_0026d796;
    }
  }
  else if (0x200001da < uVar1 >> 2) {
    __return_storage_ptr__->kind = UNIQUE;
    local_f0.__r = 0x7fffffffffffffff;
    goto LAB_0026d796;
  }
  bVar11 = anon_unknown_10::make_time(cs,0,&local_f0.__r,&local_a0);
  if ((!bVar11) ||
     (bVar11 = anon_unknown_10::make_time(cs,1,&local_f8.__r,&local_d8), dVar15.__r = local_f0.__r,
     !bVar11)) {
    local_68.tm_sec = 0x7b2;
    local_68.tm_min = 0;
    local_68.tm_hour = 0x101;
    local_68.tm_mday._0_1_ = 0;
    bVar11 = detail::operator<(cs,(civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                   *)&local_68);
    rVar16 = -0x8000000000000000;
    if (!bVar11) {
      rVar16 = 0x7fffffffffffffff;
    }
    __return_storage_ptr__->kind = UNIQUE;
    (__return_storage_ptr__->pre).__d.__r = rVar16;
    (__return_storage_ptr__->trans).__d.__r = rVar16;
    (__return_storage_ptr__->post).__d.__r = rVar16;
    return __return_storage_ptr__;
  }
  if (local_a0.tm_isdst != local_d8.tm_isdst) {
    local_e4 = local_a0.tm_isdst;
    lVar17 = local_a0.tm_gmtoff;
    if (local_f0.__r < local_f8.__r) {
      local_f0.__r = local_f8.__r;
      local_f8.__r = dVar15.__r;
      lVar17 = local_d8.tm_gmtoff;
    }
    dVar15.__r = local_f0.__r;
    local_108 = local_f8.__r;
    do {
      lVar18 = dVar15.__r;
      if (local_108 + 1 == dVar15.__r) break;
      local_e0 = (dVar15.__r - local_108) / 2 + local_108;
      ptVar13 = localtime_r(&local_e0,&local_68);
      if (ptVar13 == (tm *)0x0) {
        local_108 = local_108 + 1;
        if (local_108 == dVar15.__r) break;
        do {
          ptVar14 = localtime_r(&local_108,&local_68);
          if ((ptVar14 != (tm *)0x0) && (ptVar14->tm_gmtoff == lVar17)) {
            local_100 = local_108;
            rVar16 = local_100;
            break;
          }
          local_108 = local_108 + 1;
          rVar16 = dVar15.__r;
        } while (local_108 != dVar15.__r);
      }
      else {
        lVar18 = local_e0;
        rVar16 = local_100;
        if (ptVar13->tm_gmtoff != lVar17) {
          local_108 = local_e0;
          lVar18 = dVar15.__r;
        }
      }
      local_100 = rVar16;
      dVar15.__r = lVar18;
      lVar18 = local_100;
    } while (ptVar13 != (tm *)0x0);
    local_100 = lVar18;
    if (local_e4 == 0) {
      __return_storage_ptr__->kind = REPEATED;
      dVar15.__r = local_f8.__r;
      local_f8.__r = local_f0.__r;
    }
    else {
      __return_storage_ptr__->kind = SKIPPED;
      dVar15.__r = local_f0.__r;
    }
    (__return_storage_ptr__->pre).__d.__r = dVar15.__r;
    (__return_storage_ptr__->trans).__d.__r = local_100;
    (__return_storage_ptr__->post).__d.__r = local_f8.__r;
    return __return_storage_ptr__;
  }
  if (local_a0.tm_isdst != 0) {
    local_f0.__r = local_f8.__r;
  }
  __return_storage_ptr__->kind = UNIQUE;
LAB_0026d796:
  (__return_storage_ptr__->pre).__d.__r = local_f0.__r;
  (__return_storage_ptr__->trans).__d.__r = local_f0.__r;
  (__return_storage_ptr__->post).__d.__r = local_f0.__r;
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneLibC::MakeTime(const civil_second& cs) const {
  if (!local_) {
    // If time_point<seconds> cannot hold the result we saturate.
    static const civil_second min_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::min());
    static const civil_second max_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::max());
    const time_point<seconds> tp = (cs < min_tp_cs) ? time_point<seconds>::min()
                                   : (cs > max_tp_cs)
                                       ? time_point<seconds>::max()
                                       : FromUnixSeconds(cs - civil_second());
    return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
  }

  // If tm_year cannot hold the requested year we saturate the result.
  if (cs.year() < 0) {
    if (cs.year() < std::numeric_limits<int>::min() + year_t{1900}) {
      const time_point<seconds> tp = time_point<seconds>::min();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  } else {
    if (cs.year() - year_t{1900} > std::numeric_limits<int>::max()) {
      const time_point<seconds> tp = time_point<seconds>::max();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  }

  // We probe with "is_dst" values of 0 and 1 to try to distinguish unique
  // civil seconds from skipped or repeated ones.  This is not always possible
  // however, as the "dst" flag does not change over some offset transitions.
  // We are also subject to the vagaries of mktime() implementations. For
  // example, some implementations treat "tm_isdst" as a demand (useless),
  // and some as a disambiguator (useful).
  std::time_t t0, t1;
  std::tm tm0, tm1;
  if (make_time(cs, 0, &t0, &tm0) && make_time(cs, 1, &t1, &tm1)) {
    if (tm0.tm_isdst == tm1.tm_isdst) {
      // The civil time was singular (pre == trans == post).
      const time_point<seconds> tp = FromUnixSeconds(tm0.tm_isdst ? t1 : t0);
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }

    tm_gmtoff_t offset = tm_gmtoff(tm0);
    if (t0 < t1) {  // negative DST
      std::swap(t0, t1);
      offset = tm_gmtoff(tm1);
    }

    const std::time_t tt = find_trans(t1, t0, offset);
    const time_point<seconds> trans = FromUnixSeconds(tt);

    if (tm0.tm_isdst) {
      // The civil time did not exist (pre >= trans > post).
      const time_point<seconds> pre = FromUnixSeconds(t0);
      const time_point<seconds> post = FromUnixSeconds(t1);
      return {time_zone::civil_lookup::SKIPPED, pre, trans, post};
    }

    // The civil time was ambiguous (pre < trans <= post).
    const time_point<seconds> pre = FromUnixSeconds(t1);
    const time_point<seconds> post = FromUnixSeconds(t0);
    return {time_zone::civil_lookup::REPEATED, pre, trans, post};
  }

  // make_time() failed somehow so we saturate the result.
  const time_point<seconds> tp = (cs < civil_second())
                                     ? time_point<seconds>::min()
                                     : time_point<seconds>::max();
  return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
}